

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcolumnview.cpp
# Opt level: O0

void __thiscall
QColumnViewDelegate::paint
          (QColumnViewDelegate *this,QPainter *painter,QStyleOptionViewItem *option,
          QModelIndex *index)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  QAbstractItemModel *pQVar4;
  ulong uVar5;
  QStyle *pQVar6;
  undefined8 in_RCX;
  long in_RDX;
  undefined8 in_RSI;
  QModelIndex *in_RDI;
  long in_FS_OFFSET;
  QStyle *style;
  QWidget *view;
  int width;
  bool reverse;
  QStyleOptionViewItem opt;
  QStyleOptionViewItem *in_stack_fffffffffffffe98;
  int in_stack_fffffffffffffea0;
  int in_stack_fffffffffffffea4;
  int in_stack_fffffffffffffea8;
  int in_stack_fffffffffffffeac;
  undefined4 in_stack_fffffffffffffeb0;
  undefined4 in_stack_fffffffffffffeb4;
  QStyleOptionViewItem *in_stack_fffffffffffffec8;
  QPainter *in_stack_fffffffffffffed0;
  undefined3 in_stack_fffffffffffffedc;
  uint uVar7;
  QFlagsStorageHelper<Qt::ItemFlag,_4> local_dc;
  undefined1 local_d8 [8];
  QFlags<QStyle::StateFlag> aQStack_d0 [24];
  undefined1 local_70;
  long local_60;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  uVar7 = CONCAT13(*(int *)(in_RDX + 0xc) == 1,in_stack_fffffffffffffedc);
  iVar2 = QRect::height((QRect *)in_stack_fffffffffffffe98);
  iVar2 = (iVar2 << 1) / 3;
  memset(local_d8,0xaa,0xd0);
  QStyleOptionViewItem::QStyleOptionViewItem
            ((QStyleOptionViewItem *)CONCAT44(in_stack_fffffffffffffea4,in_stack_fffffffffffffea0),
             in_stack_fffffffffffffe98);
  if ((uVar7 & 0x1000000) == 0) {
    QRect::adjust((QRect *)CONCAT44(in_stack_fffffffffffffeb4,in_stack_fffffffffffffeb0),
                  in_stack_fffffffffffffeac,in_stack_fffffffffffffea8,in_stack_fffffffffffffea4,
                  in_stack_fffffffffffffea0);
  }
  else {
    QRect::adjust((QRect *)CONCAT44(in_stack_fffffffffffffeb4,in_stack_fffffffffffffeb0),
                  in_stack_fffffffffffffeac,in_stack_fffffffffffffea8,in_stack_fffffffffffffea4,
                  in_stack_fffffffffffffea0);
  }
  pQVar4 = QModelIndex::model((QModelIndex *)0x8661a2);
  (**(code **)(*(long *)pQVar4 + 0x138))(pQVar4,in_RCX);
  local_dc.super_QFlagsStorage<Qt::ItemFlag>.i =
       (QFlagsStorage<Qt::ItemFlag>)
       QFlags<Qt::ItemFlag>::operator&
                 ((QFlags<Qt::ItemFlag> *)
                  CONCAT44(in_stack_fffffffffffffea4,in_stack_fffffffffffffea0),
                  (ItemFlag)((ulong)in_stack_fffffffffffffe98 >> 0x20));
  bVar1 = QFlags<Qt::ItemFlag>::operator!((QFlags<Qt::ItemFlag> *)&local_dc);
  if (bVar1) {
    local_70 = 1;
    QFlags<QStyle::StateFlag>::operator|=(aQStack_d0,State_Selected);
  }
  QStyledItemDelegate::paint
            ((QStyledItemDelegate *)CONCAT44(uVar7,iVar2),in_stack_fffffffffffffed0,
             in_stack_fffffffffffffec8,in_RDI);
  if ((uVar7 & 0x1000000) == 0) {
    in_stack_fffffffffffffea4 = QRect::x((QRect *)0x8662aa);
    iVar3 = QRect::width((QRect *)in_stack_fffffffffffffe98);
    iVar2 = (in_stack_fffffffffffffea4 + iVar3) - iVar2;
    iVar3 = QRect::y((QRect *)0x8662da);
    QRect::height((QRect *)in_stack_fffffffffffffe98);
    QRect::QRect((QRect *)CONCAT44(iVar3,iVar2),in_stack_fffffffffffffea4,in_stack_fffffffffffffea0,
                 (int)((ulong)in_stack_fffffffffffffe98 >> 0x20),(int)in_stack_fffffffffffffe98);
  }
  else {
    QRect::x((QRect *)0x866235);
    QRect::y((QRect *)0x866247);
    QRect::height((QRect *)in_stack_fffffffffffffe98);
    QRect::QRect((QRect *)CONCAT44(in_stack_fffffffffffffeac,in_stack_fffffffffffffea8),
                 in_stack_fffffffffffffea4,in_stack_fffffffffffffea0,
                 (int)((ulong)in_stack_fffffffffffffe98 >> 0x20),(int)in_stack_fffffffffffffe98);
  }
  pQVar4 = QModelIndex::model((QModelIndex *)0x866331);
  uVar5 = (**(code **)(*(long *)pQVar4 + 0x88))(pQVar4,in_RCX);
  if ((uVar5 & 1) != 0) {
    if (local_60 == 0) {
      pQVar6 = QApplication::style();
    }
    else {
      pQVar6 = QWidget::style((QWidget *)in_stack_fffffffffffffe98);
    }
    (**(code **)(*(long *)pQVar6 + 0xb0))(pQVar6,0x2a,local_d8,in_RSI,local_60);
  }
  QStyleOptionViewItem::~QStyleOptionViewItem
            ((QStyleOptionViewItem *)CONCAT44(in_stack_fffffffffffffea4,in_stack_fffffffffffffea0));
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QColumnViewDelegate::paint(QPainter *painter,
                          const QStyleOptionViewItem &option,
                          const QModelIndex &index) const
{
    bool reverse = (option.direction == Qt::RightToLeft);
    int width = ((option.rect.height() * 2) / 3);
    // Modify the options to give us room to add an arrow
    QStyleOptionViewItem opt = option;
    if (reverse)
        opt.rect.adjust(width,0,0,0);
    else
        opt.rect.adjust(0,0,-width,0);

    if (!(index.model()->flags(index) & Qt::ItemIsEnabled)) {
        opt.showDecorationSelected = true;
        opt.state |= QStyle::State_Selected;
    }

    QStyledItemDelegate::paint(painter, opt, index);

    if (reverse)
        opt.rect = QRect(option.rect.x(), option.rect.y(), width, option.rect.height());
    else
        opt.rect = QRect(option.rect.x() + option.rect.width() - width, option.rect.y(),
                         width, option.rect.height());

    // Draw >
    if (index.model()->hasChildren(index)) {
        const QWidget *view = opt.widget;
        QStyle *style = view ? view->style() : QApplication::style();
        style->drawPrimitive(QStyle::PE_IndicatorColumnViewArrow, &opt, painter, view);
    }
}